

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O3

void rw::d3d9::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Geometry *this;
  InstanceDataHeader *pIVar5;
  long lVar6;
  uint32 uVar7;
  uint16 *puVar8;
  MeshHeader *pMVar9;
  ulong uVar10;
  uint uVar11;
  uint *puVar12;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    uVar7 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar7;
    Geometry::allocateData(this);
    uVar11 = 0;
    Geometry::allocateMeshes
              (this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
    pIVar5 = this->instData;
    puVar8 = d3d::lockIndices(*(void **)(pIVar5 + 4),0,0,0);
    uVar7 = pIVar5[2].platform;
    if (uVar7 != 0) {
      pMVar9 = this->meshHeader + 1;
      puVar12 = *(uint **)(pIVar5 + 0x1a);
      do {
        uVar2 = puVar12[1];
        if (uVar2 == 0) {
          memcpy(*(void **)pMVar9,puVar8 + puVar12[10],(ulong)(*puVar12 * 2));
          uVar7 = pIVar5[2].platform;
        }
        else {
          uVar3 = *puVar12;
          if ((ulong)uVar3 != 0) {
            uVar4 = puVar12[10];
            lVar6 = *(long *)pMVar9;
            uVar10 = 0;
            do {
              *(uint16 *)(lVar6 + uVar10 * 2) = puVar8[uVar4 + (int)uVar10] + (short)uVar2;
              uVar10 = uVar10 + 1;
            } while (uVar3 != uVar10);
          }
        }
        pMVar9 = (MeshHeader *)&pMVar9[1].totalIndices;
        puVar12 = puVar12 + 0xc;
        uVar11 = uVar11 + 1;
      } while (uVar11 < uVar7);
    }
    d3d::unlockIndices(*(void **)(pIVar5 + 4));
    (**(code **)&rwpipe[1].super_Pipeline.platform)(this);
    Geometry::generateTriangles(this,(int8 *)0x0);
    pbVar1 = (byte *)((long)&this->flags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
    freeInstanceData(this);
    return;
  }
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_D3D9);
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	InstanceData *inst = header->inst;
	Mesh *mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(inst->minVert == 0)
			memcpy(mesh->indices, &indices[inst->startIndex], inst->numIndex*2);
		else
			for(uint32 j = 0; j < inst->numIndex; j++)
				mesh->indices[j] = indices[inst->startIndex+j] + inst->minVert;
		mesh++;
		inst++;
	}
	unlockIndices(header->indexBuffer);

	pipe->uninstanceCB(geo, header);
	geo->generateTriangles();
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}